

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O0

void Extra_FileLineNumAdd(char *pFileName,char *pFileNameOut)

{
  FILE *__stream;
  FILE *__stream_00;
  char *pcVar1;
  size_t sVar2;
  uint local_41c;
  int iLine;
  FILE *pFile2;
  FILE *pFile;
  char Buffer [1000];
  char *pFileNameOut_local;
  char *pFileName_local;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    printf("Extra_FileLineNumAdd(): Cannot open file \"%s\".\n",pFileName);
  }
  else {
    __stream_00 = fopen(pFileNameOut,"wb");
    if (__stream_00 == (FILE *)0x0) {
      fclose(__stream);
      printf("Extra_FileLineNumAdd(): Cannot open file \"%s\".\n",pFileNameOut);
    }
    else {
      local_41c = 0;
      while( true ) {
        pcVar1 = fgets((char *)&pFile,1000,__stream);
        if (pcVar1 == (char *)0x0) break;
        sVar2 = strlen((char *)&pFile);
        sprintf((char *)((long)&pFile2 + sVar2 + 6),"%03d\n%c",(ulong)local_41c,0);
        fputs((char *)&pFile,__stream_00);
        local_41c = local_41c + 1;
      }
      fclose(__stream);
      fclose(__stream_00);
      printf("The resulting file is \"%s\".\n",pFileNameOut);
    }
  }
  return;
}

Assistant:

void Extra_FileLineNumAdd( char * pFileName, char * pFileNameOut )
{
    char Buffer[1000];
    FILE * pFile;
    FILE * pFile2;
    int iLine;
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    {
        printf( "Extra_FileLineNumAdd(): Cannot open file \"%s\".\n", pFileName );
        return;
    }
    pFile2 = fopen( pFileNameOut, "wb" );
    if ( pFile2 == NULL )
    {
        fclose( pFile );
        printf( "Extra_FileLineNumAdd(): Cannot open file \"%s\".\n", pFileNameOut );
        return;
    }
    for ( iLine = 0; fgets( Buffer, 1000, pFile ); iLine++ )
    {
        sprintf( Buffer + strlen(Buffer) - 2, "%03d\n%c", iLine, 0 );
        fputs( Buffer, pFile2 );
    }
    fclose( pFile );
    fclose( pFile2 );
    // report the result
    printf( "The resulting file is \"%s\".\n", pFileNameOut );
}